

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateInfo.cpp
# Opt level: O0

int helics::getOptionIndex(string *val)

{
  __const_iterator __last;
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_42UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *puVar1;
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_42UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *puVar2;
  const_iterator pvVar3;
  const_iterator pvVar4;
  iterator __first;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  value_type *fnd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  const_iterator pvVar5;
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_42UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *in_stack_ffffffffffffffa0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last_00;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffa8;
  string *in_stack_ffffffffffffffb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 uVar6;
  int local_4;
  
  puVar1 = (unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_42UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            *)frozen::
              unordered_map<std::basic_string_view<char,std::char_traits<char>>,int,42ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
              ::find<std::__cxx11::string>(in_stack_ffffffffffffffa0,in_RDI);
  __last_00._M_current = (char *)puVar1;
  puVar2 = (unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_42UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            *)frozen::
              unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_42UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              ::end((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_42UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     *)0x3fca58);
  if ((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_42UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
       *)__last_00._M_current == puVar2) {
    gmlc::utilities::makeLowerCase(in_stack_ffffffffffffffb0);
    pvVar3 = frozen::
             unordered_map<std::basic_string_view<char,std::char_traits<char>>,int,42ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
             ::find<std::__cxx11::string>
                       ((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_42UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                         *)__last_00._M_current,in_RDI);
    pvVar5 = pvVar3;
    pvVar4 = frozen::
             unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_42UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ::end((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_42UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    *)0x3fcaac);
    if (pvVar5 == pvVar4) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                (in_stack_ffffffffffffff88);
      __first = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::end(in_RDI);
      uVar6 = 0x5f;
      std::remove<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                (in_stack_ffffffffffffffa8,__last_00,(char *)in_RDI);
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)pvVar5,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_ffffffffffffff88);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                (in_RDI);
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)pvVar5,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_ffffffffffffff88);
      __last._M_current._7_1_ = uVar6;
      __last._M_current._0_7_ = in_stack_ffffffffffffffc0;
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                (in_stack_ffffffffffffffb8,(__const_iterator)__first._M_current,__last);
      pvVar3 = frozen::
               unordered_map<std::basic_string_view<char,std::char_traits<char>>,int,42ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
               ::find<std::__cxx11::string>
                         ((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_42UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                           *)__last_00._M_current,in_RDI);
      pvVar5 = pvVar3;
      pvVar4 = frozen::
               unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_42UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ::end((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_42UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      *)0x3fcb77);
      if (pvVar5 == pvVar4) {
        local_4 = -0x65;
      }
      else {
        local_4 = pvVar3->second;
      }
    }
    else {
      local_4 = pvVar3->second;
    }
  }
  else {
    local_4 = *(int *)&(puVar1->items_).data_[0].first._M_str;
  }
  return local_4;
}

Assistant:

int getOptionIndex(std::string val)
{
    const auto* fnd = optionStringsTranslations.find(val);
    if (fnd != optionStringsTranslations.end()) {
        return fnd->second;
    }
    gmlc::utilities::makeLowerCase(val);
    fnd = optionStringsTranslations.find(val);
    if (fnd != optionStringsTranslations.end()) {
        return fnd->second;
    }
    val.erase(std::remove(val.begin(), val.end(), '_'), val.end());
    fnd = optionStringsTranslations.find(val);
    if (fnd != optionStringsTranslations.end()) {
        return fnd->second;
    }
    return HELICS_INVALID_OPTION_INDEX;
}